

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O1

uint8_t gb_read_mbc_1(MemoryBankController *mc,uint16_t address)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  undefined6 in_register_00000032;
  
  uVar3 = (uint)CONCAT62(in_register_00000032,address);
  if (uVar3 < 0x4000) {
    uVar2 = 0;
    if (mc->banking_mode == Banking_Mode_RAM) {
      uVar2 = (uint)mc->banking_register_2 << 5;
    }
    return mc->rom[(uVar2 & mc->rom_bank_mask) << 0xe | uVar3];
  }
  if (-1 < (short)address) {
    return mc->rom[(ulong)((((uint)mc->banking_register_1 | (uint)mc->banking_register_2 << 5) &
                           mc->rom_bank_mask) << 0xe) + (ulong)(uVar3 - 0x4000)];
  }
  if ((uVar3 & 0xe000) == 0xa000) {
    uVar1 = 0xff;
    if (mc->ram_enabled == true) {
      if (mc->banking_mode == Banking_Mode_ROM) {
        uVar2 = 0;
      }
      else {
        uVar2 = (uint)mc->banking_register_2;
      }
      uVar1 = mc->ram[(uVar2 & mc->ram_bank_mask) << 0xd | uVar3 - 0xa000];
    }
    return uVar1;
  }
  uVar1 = gb_common_reads(mc,address);
  return uVar1;
}

Assistant:

uint8_t gb_read_mbc_1(MemoryBankController* mc, uint16_t address) {

    if (address <= 0x3FFF) {
        int effective_bank = 0;
        if(mc->banking_mode == Banking_Mode_RAM) {
            effective_bank = (mc->banking_register_2 << 5);
        }

        return mc->rom[address + (effective_bank & mc->rom_bank_mask) * ROM_BANK_SIZE];
    }

    if(address >= 0x4000 && address <= 0x7FFF) {
        int offset = address - ROM_BANK_SIZE;
        int effective_bank = ((mc->banking_register_2 << 5) | (mc->banking_register_1));
        int read_addr = offset + (effective_bank & mc->rom_bank_mask) * ROM_BANK_SIZE;
        return mc->rom[read_addr];
    }
    
    if (address >= 0xA000 && address <= 0xBFFF) {
        if (mc->ram_enabled) {
            int offset = address - 0xA000;
            int ram_bank = mc->banking_mode == Banking_Mode_ROM ? 0 : (mc->banking_register_2);
            int read_addr = offset + (ram_bank & mc->ram_bank_mask) * RAM_BANK_SIZE;
            return mc->ram[read_addr];
        }
        return 0xFF;
    }

    return gb_common_reads(mc, address);
}